

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetStringRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,StringRefType *s,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  bool bVar1;
  ShortString *pSVar2;
  Ch *__src;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDX;
  GenericStringRef *in_RSI;
  ShortString *in_RDI;
  Ch *str;
  size_t size;
  
  size = 0;
  bVar1 = ShortString::Usable(*(SizeType *)(in_RSI + 8));
  if (bVar1) {
    in_RDI[1].str[0] = '\x05';
    in_RDI[1].str[1] = '\x1c';
    ShortString::SetLength(in_RDI,*(SizeType *)(in_RSI + 8));
  }
  else {
    in_RDI[1].str[0] = '\x05';
    in_RDI[1].str[1] = '\f';
    *(undefined4 *)in_RDI->str = *(undefined4 *)(in_RSI + 8);
    pSVar2 = (ShortString *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(in_RDX,size);
    *(ulong *)(in_RDI->str + 8) = *(ulong *)(in_RDI->str + 8) & 0xffff000000000000 | (ulong)pSVar2;
    in_RDI = pSVar2;
  }
  pSVar2 = in_RDI;
  __src = GenericStringRef::operator_cast_to_char_(in_RSI);
  memcpy(in_RDI,__src,(ulong)*(uint *)(in_RSI + 8));
  pSVar2->str[*(uint *)(in_RSI + 8)] = '\0';
  return;
}

Assistant:

void SetStringRaw(StringRefType s, Allocator& allocator) {
        Ch* str = 0;
        if (ShortString::Usable(s.length)) {
            data_.f.flags = kShortStringFlag;
            data_.ss.SetLength(s.length);
            str = data_.ss.str;
        } else {
            data_.f.flags = kCopyStringFlag;
            data_.s.length = s.length;
            str = static_cast<Ch *>(allocator.Malloc((s.length + 1) * sizeof(Ch)));
            SetStringPointer(str);
        }
        std::memcpy(str, s, s.length * sizeof(Ch));
        str[s.length] = '\0';
    }